

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O3

void __thiscall bloom_filter::bloom_filter(bloom_filter *this,bloom_parameters *p)

{
  ulong in_RAX;
  undefined8 uStack_28;
  
  this->_vptr_bloom_filter = (_func_int **)&PTR__bloom_filter_0012dbf0;
  (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bit_table_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bit_table_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bit_table_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->projected_element_count_ = p->projected_element_count;
  this->inserted_element_count_ = 0;
  this->random_seed_ = p->random_seed * 0xa5a5a5a5 + 1;
  this->desired_false_positive_probability_ = p->false_positive_probability;
  this->salt_count_ = (p->optimal_parameters).number_of_hashes;
  this->table_size_ = (p->optimal_parameters).table_size;
  uStack_28 = in_RAX;
  generate_unique_salt(this);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->bit_table_,this->table_size_ >> 3,(value_type_conflict3 *)((long)&uStack_28 + 7)
            );
  return;
}

Assistant:

bloom_filter(const bloom_parameters& p)
   : projected_element_count_(p.projected_element_count),
     inserted_element_count_(0),
     random_seed_((p.random_seed * 0xA5A5A5A5) + 1),
     desired_false_positive_probability_(p.false_positive_probability)
   {
      salt_count_ = p.optimal_parameters.number_of_hashes;
      table_size_ = p.optimal_parameters.table_size;

      generate_unique_salt();

      bit_table_.resize(table_size_ / bits_per_char, static_cast<unsigned char>(0x00));
   }